

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation.cpp
# Opt level: O2

void __thiscall
QVariantAnimationPrivate::setValueAt(QVariantAnimationPrivate *this,qreal step,QVariant *value)

{
  KeyValues *this_00;
  iterator iVar1;
  iterator iVar2;
  long in_FS_OFFSET;
  undefined1 local_58 [32];
  undefined1 *puStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((step < 0.0) || (1.0 < step)) {
    local_58._0_4_ = 2;
    local_58._20_4_ = 0;
    local_58._4_4_ = 0;
    local_58._8_4_ = 0;
    local_58._12_4_ = 0;
    local_58._16_4_ = 0;
    local_58._24_8_ = "default";
    QMessageLogger::warning
              ((QMessageLogger *)local_58,"QVariantAnimation::setValueAt: invalid step = %f");
    goto LAB_0036dad6;
  }
  local_58._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_4_ = 0xaaaaaaaa;
  local_58._12_4_ = 0xaaaaaaaa;
  local_58._16_4_ = 0xaaaaaaaa;
  local_58._20_4_ = 0xaaaaaaaa;
  local_58._0_8_ = step;
  ::QVariant::QVariant((QVariant *)(local_58 + 8),value);
  this_00 = &this->keyValues;
  iVar1 = QList<std::pair<double,_QVariant>_>::begin(this_00);
  iVar2 = QList<std::pair<double,_QVariant>_>::end(this_00);
  iVar1 = std::
          __lower_bound<QList<std::pair<double,QVariant>>::iterator,std::pair<double,QVariant>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(std::pair<double,QVariant>const&,std::pair<double,QVariant>const&)>>
                    (iVar1,iVar2,(pair<double,_QVariant> *)local_58,
                     (_Iter_comp_val<bool_(*)(const_std::pair<double,_QVariant>_&,_const_std::pair<double,_QVariant>_&)>
                      )0x36d76d);
  iVar2 = QList<std::pair<double,_QVariant>_>::end(this_00);
  if (iVar1.i == iVar2.i) {
LAB_0036dab3:
    QList<std::pair<double,_QVariant>_>::insert
              (this_00,(const_iterator)iVar1.i,(parameter_type)local_58);
  }
  else {
    if (((iVar1.i)->first != step) || (NAN((iVar1.i)->first) || NAN(step))) goto LAB_0036dab3;
    if (*(ulong *)&(value->d).field_0x18 < 4) {
      QList<std::pair<double,_QVariant>_>::erase(this_00,(const_iterator)iVar1.i);
    }
    else {
      ::QVariant::operator=(&(iVar1.i)->second,value);
    }
  }
  recalculateCurrentInterval(this,true);
  ::QVariant::~QVariant((QVariant *)(local_58 + 8));
LAB_0036dad6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QVariantAnimationPrivate::setValueAt(qreal step, const QVariant &value)
{
    if (step < qreal(0.0) || step > qreal(1.0)) {
        qWarning("QVariantAnimation::setValueAt: invalid step = %f", step);
        return;
    }

    QVariantAnimation::KeyValue pair(step, value);

    QVariantAnimation::KeyValues::iterator result = std::lower_bound(keyValues.begin(), keyValues.end(), pair, animationValueLessThan);
    if (result == keyValues.end() || result->first != step) {
        keyValues.insert(result, pair);
    } else {
        if (value.isValid())
            result->second = value; // replaces the previous value
        else
            keyValues.erase(result); // removes the previous value
    }

    recalculateCurrentInterval(/*force=*/true);
}